

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O2

int av1_get_palette_cache(MACROBLOCKD *xd,int plane,uint16_t *cache)

{
  uint16_t *puVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  MB_MODE_INFO *pMVar9;
  PALETTE_MODE_INFO *pPVar10;
  uint uVar11;
  long lVar12;
  PALETTE_MODE_INFO *pPVar13;
  MB_MODE_INFO *pMVar14;
  ulong uVar15;
  long lVar16;
  
  uVar11 = 0;
  if ((-xd->mb_to_top_edge & 0x1f8U) == 0) {
    pMVar14 = xd->left_mbmi;
    pMVar9 = (MB_MODE_INFO *)0x0;
    bVar5 = true;
    uVar11 = 0;
  }
  else {
    pMVar14 = xd->left_mbmi;
    pMVar9 = xd->above_mbmi;
    if (pMVar9 == (MB_MODE_INFO *)0x0) {
      bVar5 = true;
      pMVar9 = (MB_MODE_INFO *)0x0;
    }
    else {
      uVar11 = (uint)*(byte *)((long)pMVar9 + (0x8f - (ulong)(plane == 0)));
      bVar5 = false;
    }
  }
  uVar7 = 0;
  if (pMVar14 != (MB_MODE_INFO *)0x0) {
    uVar7 = (uint)*(byte *)((long)pMVar14 + (0x8f - (ulong)(plane == 0)));
  }
  if (uVar11 == 0 && uVar7 == 0) {
    return 0;
  }
  uVar8 = plane << 3;
  uVar6 = 0;
  pPVar13 = (PALETTE_MODE_INFO *)0x0;
  if (!bVar5) {
    pPVar13 = &pMVar9->palette_mode_info;
  }
  pPVar10 = &pMVar14->palette_mode_info;
  if (pMVar14 == (MB_MODE_INFO *)0x0) {
    pPVar10 = (PALETTE_MODE_INFO *)0x0;
  }
  uVar15 = (ulong)uVar8;
  do {
    lVar16 = (long)(int)uVar8;
    uVar15 = (ulong)(int)uVar15;
    do {
      if ((uVar11 == 0) || (uVar7 == 0)) {
        do {
          uVar4 = uVar15;
          do {
            uVar8 = uVar11;
            uVar15 = uVar4 + 1;
            if ((int)uVar8 < 1) {
              do {
                lVar12 = lVar16;
                do {
                  uVar11 = uVar7;
                  lVar16 = lVar12 + 1;
                  if ((int)uVar11 < 1) {
                    return uVar6;
                  }
                  puVar1 = pPVar10->palette_colors + lVar12;
                } while ((0 < (int)uVar6) &&
                        (uVar7 = uVar11 - 1, lVar12 = lVar16, cache[(ulong)uVar6 - 1] == *puVar1));
                lVar12 = (long)(int)uVar6;
                uVar6 = uVar6 + 1;
                cache[lVar12] = *puVar1;
                uVar7 = uVar11 - 1;
              } while( true );
            }
            puVar1 = pPVar13->palette_colors + uVar4;
          } while ((0 < (int)uVar6) &&
                  (uVar11 = uVar8 - 1, uVar4 = uVar15, cache[(ulong)uVar6 - 1] == *puVar1));
          lVar12 = (long)(int)uVar6;
          uVar6 = uVar6 + 1;
          cache[lVar12] = *puVar1;
          uVar11 = uVar8 - 1;
        } while( true );
      }
      uVar2 = pPVar13->palette_colors[uVar15];
      uVar3 = pPVar10->palette_colors[lVar16];
      if (uVar3 < uVar2) {
        if (((int)uVar6 < 1) || (cache[(ulong)uVar6 - 1] != uVar3)) {
          cache[(int)uVar6] = uVar3;
          uVar6 = uVar6 + 1;
        }
        break;
      }
      if (((int)uVar6 < 1) || (cache[(ulong)uVar6 - 1] != uVar2)) {
        cache[(int)uVar6] = uVar2;
        uVar6 = uVar6 + 1;
      }
      uVar15 = uVar15 + 1;
      uVar11 = uVar11 - 1;
    } while (uVar3 != uVar2);
    uVar7 = uVar7 - 1;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

int av1_get_palette_cache(const MACROBLOCKD *const xd, int plane,
                          uint16_t *cache) {
  const int row = -xd->mb_to_top_edge >> 3;
  // Do not refer to above SB row when on SB boundary.
  const MB_MODE_INFO *const above_mi =
      (row % (1 << MIN_SB_SIZE_LOG2)) ? xd->above_mbmi : NULL;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;
  int above_n = 0, left_n = 0;
  if (above_mi) above_n = above_mi->palette_mode_info.palette_size[plane != 0];
  if (left_mi) left_n = left_mi->palette_mode_info.palette_size[plane != 0];
  if (above_n == 0 && left_n == 0) return 0;
  int above_idx = plane * PALETTE_MAX_SIZE;
  int left_idx = plane * PALETTE_MAX_SIZE;
  int n = 0;
  const uint16_t *above_colors =
      above_mi ? above_mi->palette_mode_info.palette_colors : NULL;
  const uint16_t *left_colors =
      left_mi ? left_mi->palette_mode_info.palette_colors : NULL;
  // Merge the sorted lists of base colors from above and left to get
  // combined sorted color cache.
  while (above_n > 0 && left_n > 0) {
    uint16_t v_above = above_colors[above_idx];
    uint16_t v_left = left_colors[left_idx];
    if (v_left < v_above) {
      palette_add_to_cache(cache, &n, v_left);
      ++left_idx, --left_n;
    } else {
      palette_add_to_cache(cache, &n, v_above);
      ++above_idx, --above_n;
      if (v_left == v_above) ++left_idx, --left_n;
    }
  }
  while (above_n-- > 0) {
    uint16_t val = above_colors[above_idx++];
    palette_add_to_cache(cache, &n, val);
  }
  while (left_n-- > 0) {
    uint16_t val = left_colors[left_idx++];
    palette_add_to_cache(cache, &n, val);
  }
  assert(n <= 2 * PALETTE_MAX_SIZE);
  return n;
}